

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void service_stop(service *svc)

{
  long in_RDI;
  char *in_stack_00000068;
  char *in_stack_00000070;
  
  *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) & 0xfffffff3;
  *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 1;
  if (*(int *)(in_RDI + 0x24) == 0) {
    notify_service_state(in_stack_00000070,in_stack_00000068);
  }
  else {
    log_write(5,"<5>init: service \'%s\' is being killed\n",*(undefined8 *)(in_RDI + 0x10));
    kill(-*(int *)(in_RDI + 0x24),0xf);
    notify_service_state(in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void service_stop(struct service *svc)
{
        /* we are no longer running, nor should we
         * attempt to restart
         */
    svc->flags &= (~(SVC_RUNNING|SVC_RESTARTING));

        /* if the service has not yet started, prevent
         * it from auto-starting with its class
         */
    svc->flags |= SVC_DISABLED;

    if (svc->pid) {
        NOTICE("service '%s' is being killed\n", svc->name);
        kill(-svc->pid, SIGTERM);
        notify_service_state(svc->name, "stopping");
    } else {
        notify_service_state(svc->name, "stopped");
    }
}